

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

void opj_write_float_LE(OPJ_BYTE *p_buffer,OPJ_FLOAT32 p_value)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 in_register_00001204 [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar16._4_12_ = in_register_00001204;
  auVar16._0_4_ = p_value;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar16._0_13_;
  auVar5[0xe] = in_register_00001204[3];
  auVar6[0xc] = in_register_00001204[2];
  auVar6._0_12_ = auVar16._0_12_;
  auVar6._13_2_ = auVar5._13_2_;
  auVar7[0xb] = 0;
  auVar7._0_11_ = auVar16._0_11_;
  auVar7._12_3_ = auVar6._12_3_;
  auVar8[10] = in_register_00001204[1];
  auVar8._0_10_ = auVar16._0_10_;
  auVar8._11_4_ = auVar7._11_4_;
  auVar9[9] = 0;
  auVar9._0_9_ = auVar16._0_9_;
  auVar9._10_5_ = auVar8._10_5_;
  auVar10[8] = in_register_00001204[0];
  auVar10._0_8_ = auVar16._0_8_;
  auVar10._9_6_ = auVar9._9_6_;
  auVar12._7_8_ = 0;
  auVar12._0_7_ = auVar10._8_7_;
  auVar14._1_8_ = SUB158(auVar12 << 0x40,7);
  auVar14[0] = (char)((uint)p_value >> 0x18);
  auVar14._9_6_ = 0;
  auVar11[4] = (char)((uint)p_value >> 0x10);
  auVar11._0_4_ = p_value;
  auVar11._5_10_ = SUB1510(auVar14 << 0x30,5);
  auVar13._11_4_ = 0;
  auVar13._0_11_ = auVar11._4_11_;
  auVar15._3_12_ = SUB1512(auVar13 << 0x20,3);
  auVar15[2] = (char)((uint)p_value >> 8);
  auVar15[0] = SUB41(p_value,0);
  auVar15[1] = 0;
  auVar15[0xf] = 0;
  auVar16 = pshuflw(auVar15,auVar15,0x1b);
  sVar1 = auVar16._0_2_;
  sVar2 = auVar16._2_2_;
  sVar3 = auVar16._4_2_;
  sVar4 = auVar16._6_2_;
  *(uint *)p_buffer =
       CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar16[6] - (0xff < sVar4),
                CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar16[4] - (0xff < sVar3),
                         CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar16[2] - (0xff < sVar2),
                                  (0 < sVar1) * (sVar1 < 0x100) * auVar16[0] - (0xff < sVar1))));
  return;
}

Assistant:

void opj_write_float_LE(OPJ_BYTE * p_buffer, OPJ_FLOAT32 p_value)
{
    const OPJ_BYTE * l_data_ptr = ((const OPJ_BYTE *) &p_value) + sizeof(
                                      OPJ_FLOAT32) - 1;
    OPJ_UINT32 i;
    for (i = 0; i < sizeof(OPJ_FLOAT32); ++i) {
        *(p_buffer++) = *(l_data_ptr--);
    }
}